

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  uint uVar3;
  Message *pMVar4;
  char *str;
  RE *pRVar5;
  ostream *poVar6;
  int exit_code;
  string local_150;
  GTestLog local_12c;
  string local_128;
  string local_108;
  string local_e8;
  char *local_c8;
  undefined1 local_b9;
  undefined1 local_b8 [7];
  bool matched;
  string local_98;
  string local_78;
  char *local_58;
  Message local_50;
  Message buffer;
  undefined1 local_40 [7];
  bool success;
  string error_message;
  bool status_ok_local;
  DeathTestImpl *this_local;
  
  error_message.field_2._M_local_buf[0xf] = status_ok;
  bVar1 = spawned(this);
  if (bVar1) {
    GetCapturedStderr_abi_cxx11_();
    buffer.ss_.ptr_._7_1_ = 0;
    Message::Message(&local_50);
    pMVar4 = Message::operator<<(&local_50,(char (*) [13])"Death test: ");
    local_58 = statement(this);
    pMVar4 = Message::operator<<(pMVar4,&local_58);
    Message::operator<<(pMVar4,(char (*) [2])0x18ae3f);
    DVar2 = outcome(this);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog(&local_12c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                         ,0x248);
      poVar6 = GTestLog::GetStream(&local_12c);
      std::operator<<(poVar6,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog(&local_12c);
      break;
    case DIED:
      if ((error_message.field_2._M_local_buf[0xf] & 1U) == 0) {
        pMVar4 = Message::operator<<(&local_50,
                                     (char (*) [51])
                                     "    Result: died but not with expected exit code:\n");
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"            ");
        uVar3 = status(this);
        ExitSummary_abi_cxx11_(&local_108,(internal *)(ulong)uVar3,exit_code);
        pMVar4 = Message::operator<<(pMVar4,&local_108);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x18ae3f);
        pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
        FormatDeathTestOutput(&local_128,(string *)local_40);
        Message::operator<<(pMVar4,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_108);
      }
      else {
        str = (char *)std::__cxx11::string::c_str();
        pRVar5 = regex(this);
        local_b9 = RE::PartialMatch(str,pRVar5);
        if ((bool)local_b9) {
          buffer.ss_.ptr_._7_1_ = 1;
        }
        else {
          pMVar4 = Message::operator<<(&local_50,
                                       (char (*) [47])
                                       "    Result: died but not with expected error.\n");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"  Expected: ");
          pRVar5 = regex(this);
          local_c8 = RE::pattern(pRVar5);
          pMVar4 = Message::operator<<(pMVar4,&local_c8);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x18ae3f);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [13])"Actual msg:\n");
          FormatDeathTestOutput(&local_e8,(string *)local_40);
          Message::operator<<(pMVar4,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
        }
      }
      break;
    case LIVED:
      pMVar4 = Message::operator<<(&local_50,(char (*) [28])"    Result: failed to die.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_78,(string *)local_40);
      Message::operator<<(pMVar4,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      break;
    case RETURNED:
      pMVar4 = Message::operator<<(&local_50,
                                   (char (*) [47])"    Result: illegal return in test statement.\n")
      ;
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput((string *)local_b8,(string *)local_40);
      Message::operator<<(pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
      break;
    case THREW:
      pMVar4 = Message::operator<<(&local_50,(char (*) [33])"    Result: threw an exception.\n");
      pMVar4 = Message::operator<<(pMVar4,(char (*) [13])" Error msg:\n");
      FormatDeathTestOutput(&local_98,(string *)local_40);
      Message::operator<<(pMVar4,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    Message::GetString_abi_cxx11_(&local_150,&local_50);
    DeathTest::set_last_death_test_message(&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    this_local._7_1_ = (bool)(buffer.ss_.ptr_._7_1_ & 1);
    Message::~Message(&local_50);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetCapturedStderr();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
# if GTEST_USES_PCRE
        // PCRE regexes support embedded NULs.
        // GTEST_USES_PCRE is defined only in google3 mode
        const bool matched = RE::PartialMatch(error_message, *regex());
# else
        const bool matched = RE::PartialMatch(error_message.c_str(), *regex());
# endif  // GTEST_USES_PCRE
        if (matched) {
          success = true;
        } else {
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << regex()->pattern() << "\n"
                 << "Actual msg:\n" << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}